

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::assign(WorkData *this,uint32_t varId,uint32_t regId)

{
  int line;
  bool bVar1;
  char *msg;
  
  bVar1 = isAssigned(this,regId);
  if (bVar1) {
    msg = "!isAssigned(regId)";
    line = 0x74;
  }
  else {
    if (this->_physToVarId[regId] == 0xff) {
      this->_physToVarId[regId] = (uint8_t)varId;
      this->_assignedRegs = this->_assignedRegs ^ 1 << ((byte)regId & 0x1f);
      return;
    }
    msg = "_physToVarId[regId] == kVarIdNone";
    line = 0x75;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
             ,line,msg);
}

Assistant:

inline void assign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(!isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == kVarIdNone);

      _physToVarId[regId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(regId);
    }